

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall
ChainstateManager::ChainstateManager
          (ChainstateManager *this,SignalInterrupt *interrupt,Options options,
          Options blockman_options)

{
  arith_uint256 *paVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  Options opts;
  int i;
  _Base_ptr p_Var6;
  undefined8 *in_RCX;
  long lVar7;
  long *in_RDX;
  pointer *__ptr;
  CChainParams *pCVar8;
  long *plVar9;
  optional<uint256> *poVar10;
  long in_FS_OFFSET;
  byte bVar11;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *puVar12;
  CCheckQueue<CScriptCheck> *this_00;
  undefined8 uVar13;
  undefined1 uVar14;
  undefined7 uVar15;
  undefined1 uVar16;
  undefined8 uVar17;
  undefined1 in_stack_ffffffffffffff71 [39];
  arith_uint256 local_58;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar12 = &this->m_snapshot_chainstate;
  this->m_last_notified_header = (CBlockIndex *)0x0;
  (this->m_last_presync_update).__d.__r = 0;
  this->m_active_chainstate = (Chainstate *)0x0;
  this->m_best_invalid = (CBlockIndex *)0x0;
  (this->m_ibd_chainstate)._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
  _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  (this->m_snapshot_chainstate)._M_t.
  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  p_Var6 = &(this->m_warningcache)._M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar7 = 0x570;
  do {
    ((_Rb_tree_node_base *)&p_Var6->_M_color)->_M_color = _S_red;
    p_Var6->_M_parent = (_Base_ptr)0x0;
    p_Var6->_M_left = p_Var6;
    p_Var6->_M_right = p_Var6;
    *(undefined8 *)(p_Var6 + 1) = 0;
    p_Var6 = (_Base_ptr)&p_Var6[1]._M_left;
    lVar7 = lVar7 + -0x30;
  } while (lVar7 != 0);
  this_00 = &this->m_script_check_queue;
  CCheckQueue<CScriptCheck>::CCheckQueue(this_00,0x80,(int)in_RDX[0x17]);
  (this->restart_indexes).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->restart_indexes)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->restart_indexes).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->restart_indexes).super__Function_base._M_functor + 8) = 0;
  (this->time_chainstate).__r = 0;
  (this->time_post_connect).__r = 0;
  (this->time_connect_total).__r = 0;
  (this->time_flush).__r = 0;
  (this->time_total).__r = 0;
  this->num_blocks_total = 0;
  (this->time_undo).__r = 0;
  (this->time_index).__r = 0;
  (this->time_connect).__r = 0;
  (this->time_verify).__r = 0;
  (this->time_check).__r = 0;
  (this->time_forks).__r = 0;
  this->m_interrupt = interrupt;
  pCVar8 = (CChainParams *)*in_RDX;
  if (*(char *)((long)in_RDX + 0x34) == '\0') {
    bVar3 = pCVar8->fDefaultConsistencyChecks;
    *(undefined1 *)((long)in_RDX + 0x34) = 1;
    *(uint *)(in_RDX + 6) = (uint)bVar3;
  }
  paVar1 = (arith_uint256 *)((long)in_RDX + 0x3c);
  if (*(char *)((long)in_RDX + 0x5c) == '\0') {
    UintToArith256(&local_58,&(pCVar8->consensus).nMinimumChainWork);
    if (*(char *)((long)in_RDX + 0x5c) == '\0') {
      *(undefined8 *)((long)in_RDX + 0x4c) = local_58.super_base_uint<256U>.pn._16_8_;
      *(undefined8 *)((long)in_RDX + 0x54) = local_58.super_base_uint<256U>.pn._24_8_;
      *(undefined8 *)(paVar1->super_base_uint<256U>).pn = local_58.super_base_uint<256U>.pn._0_8_;
      *(undefined8 *)((long)in_RDX + 0x44) = local_58.super_base_uint<256U>.pn._8_8_;
      *(undefined1 *)((long)in_RDX + 0x5c) = 1;
    }
    else if (paVar1 != &local_58) {
      *(undefined8 *)((long)in_RDX + 0x4c) = local_58.super_base_uint<256U>.pn._16_8_;
      *(undefined8 *)((long)in_RDX + 0x54) = local_58.super_base_uint<256U>.pn._24_8_;
      *(undefined8 *)(paVar1->super_base_uint<256U>).pn = local_58.super_base_uint<256U>.pn._0_8_;
      *(undefined8 *)((long)in_RDX + 0x44) = local_58.super_base_uint<256U>.pn._8_8_;
    }
    pCVar8 = (CChainParams *)*in_RDX;
  }
  if ((char)in_RDX[0x10] == '\0') {
    lVar7 = *(long *)(pCVar8->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems;
    lVar4 = *(long *)((pCVar8->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems +
                     8);
    lVar5 = *(long *)((pCVar8->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems +
                     0x18);
    in_RDX[0xe] = *(long *)((pCVar8->consensus).defaultAssumeValid.super_base_blob<256U>.m_data.
                            _M_elems + 0x10);
    in_RDX[0xf] = lVar5;
    in_RDX[0xc] = lVar7;
    in_RDX[0xd] = lVar4;
    *(undefined1 *)(in_RDX + 0x10) = 1;
  }
  (this->m_options).chainparams = pCVar8;
  std::filesystem::__cxx11::path::path(&(this->m_options).datadir.super_path,(path *)(in_RDX + 1));
  (this->m_options).checkpoints_enabled = SUB81(in_RDX[7],0);
  (this->m_options).check_block_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = *(_Optional_payload_base<int> *)(in_RDX + 6);
  (this->m_options).minimum_chain_work.super__Optional_base<arith_uint256,_false,_false>._M_payload.
  super__Optional_payload_base<arith_uint256>._M_engaged = false;
  if (*(char *)((long)in_RDX + 0x5c) == '\x01') {
    lVar7 = 0;
    do {
      *(uint32_t *)
       ((long)&(this->m_options).minimum_chain_work.
               super__Optional_base<arith_uint256,_false,_false>._M_payload.
               super__Optional_payload_base<arith_uint256>._M_payload + lVar7 * 4) =
           (paVar1->super_base_uint<256U>).pn[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    (this->m_options).minimum_chain_work.super__Optional_base<arith_uint256,_false,_false>.
    _M_payload.super__Optional_payload_base<arith_uint256>._M_engaged = true;
  }
  plVar9 = in_RDX + 0xc;
  poVar10 = &(this->m_options).assumed_valid_block;
  for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(long *)&(poVar10->super__Optional_base<uint256,_true,_true>)._M_payload.
              super__Optional_payload_base<uint256>._M_payload = *plVar9;
    plVar9 = plVar9 + (ulong)bVar11 * -2 + 1;
    poVar10 = (optional<uint256> *)((long)poVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  (this->m_thread_load)._M_id._M_thread = 0;
  uVar13 = *in_RCX;
  uVar17 = *(undefined8 *)((long)in_RCX + 0x11);
  uVar16 = (undefined1)((ulong)*(undefined8 *)((long)in_RCX + 9) >> 0x38);
  uVar14 = (undefined1)in_RCX[1];
  uVar15 = (undefined7)((ulong)in_RCX[1] >> 8);
  std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff78,(path *)(in_RCX + 4));
  opts._8_8_ = this_00;
  opts.chainparams = (CChainParams *)puVar12;
  opts.prune_target = uVar13;
  opts.fast_prune = (bool)uVar14;
  opts._25_7_ = uVar15;
  opts.blocks_dir.super_path._M_pathname._M_dataplus._M_p._0_1_ = uVar16;
  opts.blocks_dir.super_path._M_pathname._1_8_ = uVar17;
  opts._41_39_ = in_stack_ffffffffffffff71;
  ::node::BlockManager::BlockManager(&this->m_blockman,interrupt,opts);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  ValidationCache::ValidationCache
            (&this->m_validation_cache,(this->m_options).script_execution_cache_bytes,
             (this->m_options).signature_cache_bytes);
  (this->m_cached_finished_ibd)._M_base._M_i = false;
  this->nBlockSequenceId = 1;
  this->nBlockReverseSequenceId = -1;
  p_Var2 = &(this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[0] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[1] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[2] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[3] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[4] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[5] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[6] = 0;
  (this->nLastPreciousChainwork).super_base_uint<256U>.pn[7] = 0;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_best_header = (CBlockIndex *)0x0;
  this->m_total_coinstip_cache = 0;
  this->m_total_coinsdb_cache = 0;
  (this->m_versionbitscache).m_mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_versionbitscache).m_mutex.super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_versionbitscache).m_mutex.super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_versionbitscache).m_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_versionbitscache).m_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  lVar7 = 0;
  do {
    lVar4 = (long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_color + lVar7;
    *(undefined4 *)
     ((long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color + lVar7) = 0;
    *(undefined8 *)
     ((long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + lVar7) = 0;
    *(long *)((long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_left + lVar7) = lVar4;
    *(long *)((long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right + lVar7) = lVar4;
    *(undefined8 *)
     ((long)&(this->m_versionbitscache).m_caches[0]._M_t._M_impl.super__Rb_tree_header._M_node_count
     + lVar7) = 0;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0x60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::ChainstateManager(const util::SignalInterrupt& interrupt, Options options, node::BlockManager::Options blockman_options)
    : m_script_check_queue{/*batch_size=*/128, options.worker_threads_num},
      m_interrupt{interrupt},
      m_options{Flatten(std::move(options))},
      m_blockman{interrupt, std::move(blockman_options)},
      m_validation_cache{m_options.script_execution_cache_bytes, m_options.signature_cache_bytes}
{
}